

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O2

void __thiscall KMeans::~KMeans(KMeans *this)

{
  (this->super_Application)._vptr_Application = (_func_int **)&PTR__KMeans_0021ebd8;
  std::
  _Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
  ::~_Vector_base(&(this->continuousQueries).
                   super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
                 );
  std::
  _Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
  ::~_Vector_base(&(this->categoricalQueries).
                   super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
                 );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_launcher).super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__cxx11::string::~string((string *)&this->_pathToFiles);
  Application::~Application(&this->super_Application);
  return;
}

Assistant:

KMeans::~KMeans()
{    
}